

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int ChooseLeaf(Rtree *pRtree,RtreeCell *pCell,int iHeight,RtreeNode **ppLeaf)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long in_FS_OFFSET;
  RtreeDValue RVar8;
  RtreeDValue RVar9;
  double dVar10;
  double dVar11;
  RtreeNode *local_b8;
  i64 local_b0;
  double local_a8;
  RtreeNode *pChild;
  RtreeNode *local_70;
  RtreeCell cell;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = (RtreeNode *)0x0;
  iVar7 = 0;
  iVar4 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,&local_70);
  local_b8 = local_70;
  do {
    if ((iVar4 != 0) || (pRtree->iDepth - iHeight <= iVar7)) {
      *ppLeaf = local_b8;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return iVar4;
      }
      __stack_chk_fail();
    }
    uVar1 = *(ushort *)(local_b8->zData + 2);
    pChild = (RtreeNode *)0x0;
    local_a8 = 0.0;
    local_b0 = 0;
    bVar3 = false;
    for (uVar5 = 0; uVar6 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8), uVar6 != uVar5;
        uVar5 = uVar5 + 1) {
      cell.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
      cell.aCoord[4].i = -1;
      cell.aCoord[5].i = -1;
      cell.aCoord[6].i = -1;
      cell.aCoord[7].i = -1;
      cell.aCoord[0].i = -1;
      cell.aCoord[1].i = -1;
      cell.aCoord[2].i = -1;
      cell.aCoord[3].i = -1;
      cell.aCoord[8] = (RtreeCoord)0xffffffff;
      cell.aCoord[9] = (RtreeCoord)0xffffffff;
      nodeGetCell(pRtree,local_b8,uVar5,&cell);
      iVar4 = cellContains(pRtree,&cell,pCell);
      if (iVar4 != 0) {
        RVar8 = cellArea(pRtree,&cell);
        if (RVar8 < local_a8 || !bVar3) {
          local_b0 = cell.iRowid;
          local_a8 = RVar8;
        }
        bVar3 = true;
      }
    }
    if (!bVar3) {
      dVar11 = 0.0;
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        cell.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
        cell.aCoord[4].i = -1;
        cell.aCoord[5].i = -1;
        cell.aCoord[6].i = -1;
        cell.aCoord[7].i = -1;
        cell.aCoord[0].i = -1;
        cell.aCoord[1].i = -1;
        cell.aCoord[2].i = -1;
        cell.aCoord[3].i = -1;
        cell.aCoord[8] = (RtreeCoord)0xffffffff;
        cell.aCoord[9] = (RtreeCoord)0xffffffff;
        nodeGetCell(pRtree,local_b8,uVar5,&cell);
        RVar8 = cellArea(pRtree,&cell);
        cellUnion(pRtree,&cell,pCell);
        RVar9 = cellArea(pRtree,&cell);
        dVar10 = RVar9 - RVar8;
        if ((uVar5 == 0) || (dVar10 < dVar11)) {
LAB_001dc0a9:
          local_b0 = cell.iRowid;
          dVar11 = dVar10;
          local_a8 = RVar8;
        }
        else if ((dVar10 == dVar11) && ((!NAN(dVar10) && !NAN(dVar11) && (RVar8 < local_a8))))
        goto LAB_001dc0a9;
      }
    }
    iVar4 = nodeAcquire(pRtree,local_b0,local_b8,&pChild);
    nodeRelease(pRtree,local_b8);
    local_b8 = pChild;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

static int ChooseLeaf(
  Rtree *pRtree,               /* Rtree table */
  RtreeCell *pCell,            /* Cell to insert into rtree */
  int iHeight,                 /* Height of sub-tree rooted at pCell */
  RtreeNode **ppLeaf           /* OUT: Selected leaf page */
){
  int rc;
  int ii;
  RtreeNode *pNode = 0;
  rc = nodeAcquire(pRtree, 1, 0, &pNode);

  for(ii=0; rc==SQLITE_OK && ii<(pRtree->iDepth-iHeight); ii++){
    int iCell;
    sqlite3_int64 iBest = 0;
    int bFound = 0;
    RtreeDValue fMinGrowth = RTREE_ZERO;
    RtreeDValue fMinArea = RTREE_ZERO;
    int nCell = NCELL(pNode);
    RtreeNode *pChild = 0;

    /* First check to see if there is are any cells in pNode that completely
    ** contains pCell.  If two or more cells in pNode completely contain pCell
    ** then pick the smallest.
    */
    for(iCell=0; iCell<nCell; iCell++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, iCell, &cell);
      if( cellContains(pRtree, &cell, pCell) ){
        RtreeDValue area = cellArea(pRtree, &cell);
        if( bFound==0 || area<fMinArea ){
          iBest = cell.iRowid;
          fMinArea = area;
          bFound = 1;
        }
      }
    }
    if( !bFound ){
      /* No cells of pNode will completely contain pCell.  So pick the
      ** cell of pNode that grows by the least amount when pCell is added.
      ** Break ties by selecting the smaller cell.
      */
      for(iCell=0; iCell<nCell; iCell++){
        RtreeCell cell;
        RtreeDValue growth;
        RtreeDValue area;
        nodeGetCell(pRtree, pNode, iCell, &cell);
        area = cellArea(pRtree, &cell);
        cellUnion(pRtree, &cell, pCell);
        growth = cellArea(pRtree, &cell)-area;
        if( iCell==0
         || growth<fMinGrowth
         || (growth==fMinGrowth && area<fMinArea)
        ){
          fMinGrowth = growth;
          fMinArea = area;
          iBest = cell.iRowid;
        }
      }
    }

    rc = nodeAcquire(pRtree, iBest, pNode, &pChild);
    nodeRelease(pRtree, pNode);
    pNode = pChild;
  }

  *ppLeaf = pNode;
  return rc;
}